

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O1

bool __thiscall xmrig::OclBackend::isEnabled(OclBackend *this,Algorithm *algorithm)

{
  Config *this_00;
  OclConfig *pOVar1;
  mapped_type *pmVar2;
  String local_20;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pOVar1 = Config::cl(this_00);
  String::String(&local_20,"cn/blur");
  pmVar2 = std::
           map<xmrig::String,_xmrig::OclThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
           ::at(&(pOVar1->m_threads).m_profiles,&local_20);
  if (local_20.m_data != (char *)0x0) {
    operator_delete__(local_20.m_data);
  }
  return (pmVar2->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (pmVar2->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xmrig::OclBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cl().threads().get().isEmpty();
}